

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress4X_DCtx(HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize)

{
  U32 UVar1;
  byte *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ulong in_R8;
  U32 algoNb;
  size_t in_stack_000007c0;
  void *in_stack_000007c8;
  size_t in_stack_000007d0;
  void *in_stack_000007d8;
  HUF_DTable *in_stack_000007e0;
  undefined8 local_40;
  undefined8 local_8;
  
  if (in_RDX == 0) {
    local_8 = 0xfffffffffffffffe;
  }
  else if (in_RDX < in_R8) {
    local_8 = 0xfffffffffffffffc;
  }
  else {
    local_8 = in_RDX;
    if (in_R8 == in_RDX) {
      memcpy(in_RSI,in_RCX,in_RDX);
    }
    else if (in_R8 == 1) {
      memset(in_RSI,(uint)*in_RCX,in_RDX);
    }
    else {
      UVar1 = HUF_selectDecoder(in_RDX,in_R8);
      if (UVar1 == 0) {
        local_40 = HUF_decompress4X1_DCtx
                             (in_stack_000007e0,in_stack_000007d8,in_stack_000007d0,
                              in_stack_000007c8,in_stack_000007c0);
      }
      else {
        local_40 = HUF_decompress4X2_DCtx
                             (in_stack_000007e0,in_stack_000007d8,in_stack_000007d0,
                              in_stack_000007c8,in_stack_000007c0);
      }
      local_8 = local_40;
    }
  }
  return local_8;
}

Assistant:

size_t HUF_decompress4X_DCtx (HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
        return algoNb ? HUF_decompress4X2_DCtx(dctx, dst, dstSize, cSrc, cSrcSize) :
                        HUF_decompress4X1_DCtx(dctx, dst, dstSize, cSrc, cSrcSize) ;
    }
}